

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall
sensors_analytics::utils::ObjectNode::SetList
          (ObjectNode *this,string *property_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  mapped_type *this_00;
  ValueNode local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *value_local;
  string *property_name_local;
  ObjectNode *this_local;
  
  local_20 = value;
  value_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)property_name;
  property_name_local = (string *)this;
  ValueNode::ValueNode(&local_a8,value);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
            ::operator[](&this->properties_map_,(key_type *)value_local);
  ValueNode::operator=(this_00,&local_a8);
  ValueNode::~ValueNode(&local_a8);
  return;
}

Assistant:

void ObjectNode::SetList(const string &property_name,
                         const std::vector<string> &value) {
  properties_map_[property_name] = ValueNode(value);
}